

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::~SmallVector(SmallVector<Resource,_8UL> *this)

{
  Resource *pRVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (this->super_VectorView<Resource>).buffer_size;
  if (uVar3 != 0) {
    lVar4 = 0x20;
    uVar5 = 0;
    do {
      pRVar1 = (this->super_VectorView<Resource>).ptr;
      pvVar2 = *(void **)((long)pRVar1 + lVar4 + -0x10);
      if ((void *)((long)&pRVar1->var + lVar4) != pvVar2) {
        operator_delete(pvVar2);
        uVar3 = (this->super_VectorView<Resource>).buffer_size;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < uVar3);
  }
  (this->super_VectorView<Resource>).buffer_size = 0;
  pRVar1 = (this->super_VectorView<Resource>).ptr;
  if (pRVar1 != (Resource *)&this->stack_storage) {
    free(pRVar1);
    return;
  }
  return;
}

Assistant:

~SmallVector()
	{
		clear();
		if (this->ptr != stack_storage.data())
			free(this->ptr);
	}